

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O3

Vector<float,_2,_true> __thiscall
Nova::Vector<float,_2,_true>::operator/(Vector<float,_2,_true> *this,Vector<float,_2,_true> *a)

{
  ulong *in_RDX;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  Vector(this,a);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(this->_data)._M_elems;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *in_RDX;
  auVar2 = divps(auVar1,auVar2);
  *&(this->_data)._M_elems = ((_Type)auVar2._0_8_)._M_elems;
  return (Vector<float,_2,_true>)auVar2._0_8_;
}

Assistant:

Vector operator/(const Vector& a) const
    {
        Vector data_copy(*this);
        data_copy/=a;
        return data_copy; 
    }